

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaCheckCOSCTDerivedOK
              (xmlSchemaAbstractCtxtPtr actxt,xmlSchemaTypePtr type,xmlSchemaTypePtr baseType,
              int set)

{
  int iVar1;
  int equal;
  int set_local;
  xmlSchemaTypePtr baseType_local;
  xmlSchemaTypePtr type_local;
  xmlSchemaAbstractCtxtPtr actxt_local;
  
  iVar1 = xmlSchemaAreEqualTypes(type,baseType);
  if (iVar1 == 0) {
    if ((((set & 2U) == 0) || ((type->flags & 2U) == 0)) &&
       (((set & 1U) == 0 || ((type->flags & 4U) == 0)))) {
      if (type->baseType == baseType) {
        actxt_local._4_4_ = 0;
      }
      else if ((type->baseType->type == XML_SCHEMA_TYPE_BASIC) &&
              (type->baseType->builtInType == 0x2d)) {
        actxt_local._4_4_ = 1;
      }
      else if ((type->baseType->type == XML_SCHEMA_TYPE_COMPLEX) ||
              (type->baseType->builtInType == 0x2d)) {
        actxt_local._4_4_ = xmlSchemaCheckCOSCTDerivedOK(actxt,type->baseType,baseType,set);
      }
      else {
        actxt_local._4_4_ = xmlSchemaCheckCOSSTDerivedOK(actxt,type->baseType,baseType,set);
      }
    }
    else {
      actxt_local._4_4_ = 1;
    }
  }
  else {
    actxt_local._4_4_ = 0;
  }
  return actxt_local._4_4_;
}

Assistant:

static int
xmlSchemaCheckCOSCTDerivedOK(xmlSchemaAbstractCtxtPtr actxt,
			     xmlSchemaTypePtr type,
			     xmlSchemaTypePtr baseType,
			     int set)
{
    int equal = xmlSchemaAreEqualTypes(type, baseType);
    /* TODO: Error codes. */
    /*
    * SPEC "For a complex type definition (call it D, for derived)
    * to be validly derived from a type definition (call this
    * B, for base) given a subset of {extension, restriction}
    * all of the following must be true:"
    */
    if (! equal) {
	/*
	* SPEC (1) "If B and D are not the same type definition, then the
	* {derivation method} of D must not be in the subset."
	*/
	if (((set & SUBSET_EXTENSION) && (WXS_IS_EXTENSION(type))) ||
	    ((set & SUBSET_RESTRICTION) && (WXS_IS_RESTRICTION(type))))
	    return (1);
    } else {
	/*
	* SPEC (2.1) "B and D must be the same type definition."
	*/
	return (0);
    }
    /*
    * SPEC (2.2) "B must be D's {base type definition}."
    */
    if (type->baseType == baseType)
	return (0);
    /*
    * SPEC (2.3.1) "D's {base type definition} must not be the `ur-type
    * definition`."
    */
    if (WXS_IS_ANYTYPE(type->baseType))
	return (1);

    if (WXS_IS_COMPLEX(type->baseType)) {
	/*
	* SPEC (2.3.2.1) "If D's {base type definition} is complex, then it
	* must be validly derived from B given the subset as defined by this
	* constraint."
	*/
	return (xmlSchemaCheckCOSCTDerivedOK(actxt, type->baseType,
	    baseType, set));
    } else {
	/*
	* SPEC (2.3.2.2) "If D's {base type definition} is simple, then it
	* must be validly derived from B given the subset as defined in Type
	* Derivation OK (Simple) ($3.14.6).
	*/
	return (xmlSchemaCheckCOSSTDerivedOK(actxt, type->baseType,
	    baseType, set));
    }
}